

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O2

void pop_container(mu_Context *ctx)

{
  mu_Vec2 mVar1;
  int iVar2;
  int iVar3;
  mu_Container *pmVar4;
  undefined8 uVar5;
  char *pcVar6;
  mu_Vec2 mVar7;
  
  pmVar4 = mu_get_current_container(ctx);
  iVar2 = (ctx->layout_stack).idx;
  mVar1 = (ctx->layout_stack).items[(long)iVar2 + -1].max;
  uVar5 = *(undefined8 *)((long)&ctx->id_stack + (long)iVar2 * 0x8c + -4);
  mVar7.x = mVar1.x - (int)uVar5;
  mVar7.y = mVar1.y - (int)((ulong)uVar5 >> 0x20);
  pmVar4->content_size = mVar7;
  iVar3 = (ctx->container_stack).idx;
  if (iVar3 < 1) {
    pcVar6 = "(ctx->container_stack).idx > 0";
    uVar5 = 0x12a;
  }
  else {
    (ctx->container_stack).idx = iVar3 + -1;
    if (0 < iVar2) {
      (ctx->layout_stack).idx = iVar2 + -1;
      mu_pop_id(ctx);
      return;
    }
    pcVar6 = "(ctx->layout_stack).idx > 0";
    uVar5 = 299;
  }
  fprintf(_stderr,"Fatal error: %s:%d: assertion \'%s\' failed\n",
          "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/microui/microui.c"
          ,uVar5,pcVar6);
  abort();
}

Assistant:

static void pop_container(mu_Context *ctx) {
  mu_Container *cnt = mu_get_current_container(ctx);
  mu_Layout *layout = get_layout(ctx);
  cnt->content_size.x = layout->max.x - layout->body.x;
  cnt->content_size.y = layout->max.y - layout->body.y;
  /* pop container, layout and id */
  pop(ctx->container_stack);
  pop(ctx->layout_stack);
  mu_pop_id(ctx);
}